

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FieldAccessStats::Add(FieldAccessStats *this,FieldAccessStats *other)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FieldAccessStats *other_local;
  FieldAccessStats *this_local;
  
  if (other == (FieldAccessStats *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x39,"(other != nullptr)","other != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->totalInlineCacheCount = other->totalInlineCacheCount + this->totalInlineCacheCount;
  this->noInfoInlineCacheCount = other->noInfoInlineCacheCount + this->noInfoInlineCacheCount;
  this->monoInlineCacheCount = other->monoInlineCacheCount + this->monoInlineCacheCount;
  this->emptyMonoInlineCacheCount =
       other->emptyMonoInlineCacheCount + this->emptyMonoInlineCacheCount;
  this->polyInlineCacheCount = other->polyInlineCacheCount + this->polyInlineCacheCount;
  this->nullPolyInlineCacheCount = other->nullPolyInlineCacheCount + this->nullPolyInlineCacheCount;
  this->emptyPolyInlineCacheCount =
       other->emptyPolyInlineCacheCount + this->emptyPolyInlineCacheCount;
  this->ignoredPolyInlineCacheCount =
       other->ignoredPolyInlineCacheCount + this->ignoredPolyInlineCacheCount;
  this->highUtilPolyInlineCacheCount =
       other->highUtilPolyInlineCacheCount + this->highUtilPolyInlineCacheCount;
  this->lowUtilPolyInlineCacheCount =
       other->lowUtilPolyInlineCacheCount + this->lowUtilPolyInlineCacheCount;
  this->equivPolyInlineCacheCount =
       other->equivPolyInlineCacheCount + this->equivPolyInlineCacheCount;
  this->nonEquivPolyInlineCacheCount =
       other->nonEquivPolyInlineCacheCount + this->nonEquivPolyInlineCacheCount;
  this->disabledPolyInlineCacheCount =
       other->disabledPolyInlineCacheCount + this->disabledPolyInlineCacheCount;
  this->clonedMonoInlineCacheCount =
       other->clonedMonoInlineCacheCount + this->clonedMonoInlineCacheCount;
  this->clonedPolyInlineCacheCount =
       other->clonedPolyInlineCacheCount + this->clonedPolyInlineCacheCount;
  return;
}

Assistant:

void FieldAccessStats::Add(FieldAccessStats* other)
    {
        Assert(other != nullptr);
        this->totalInlineCacheCount += other->totalInlineCacheCount;
        this->noInfoInlineCacheCount += other->noInfoInlineCacheCount;
        this->monoInlineCacheCount += other->monoInlineCacheCount;
        this->emptyMonoInlineCacheCount += other->emptyMonoInlineCacheCount;
        this->polyInlineCacheCount += other->polyInlineCacheCount;
        this->nullPolyInlineCacheCount += other->nullPolyInlineCacheCount;
        this->emptyPolyInlineCacheCount += other->emptyPolyInlineCacheCount;
        this->ignoredPolyInlineCacheCount += other->ignoredPolyInlineCacheCount;
        this->highUtilPolyInlineCacheCount += other->highUtilPolyInlineCacheCount;
        this->lowUtilPolyInlineCacheCount += other->lowUtilPolyInlineCacheCount;
        this->equivPolyInlineCacheCount += other->equivPolyInlineCacheCount;
        this->nonEquivPolyInlineCacheCount += other->nonEquivPolyInlineCacheCount;
        this->disabledPolyInlineCacheCount += other->disabledPolyInlineCacheCount;
        this->clonedMonoInlineCacheCount += other->clonedMonoInlineCacheCount;
        this->clonedPolyInlineCacheCount += other->clonedPolyInlineCacheCount;
    }